

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O3

size_t __thiscall
MemoryLeakDetectorTable::getTotalLeaks(MemoryLeakDetectorTable *this,MemLeakPeriod period)

{
  size_t sVar1;
  int i;
  long lVar2;
  MemoryLeakDetectorNode *pMVar3;
  long lVar4;
  ulong uVar5;
  
  lVar2 = 0;
  sVar1 = 0;
  do {
    lVar4 = 0;
    for (pMVar3 = this->table_[lVar2].head_; pMVar3 != (MemoryLeakDetectorNode *)0x0;
        pMVar3 = *(MemoryLeakDetectorNode **)(pMVar3 + 0x38)) {
      uVar5 = 1;
      if ((period != mem_leak_period_all) && (*(MemLeakPeriod *)(pMVar3 + 0x30) != period)) {
        uVar5 = (ulong)(*(MemLeakPeriod *)(pMVar3 + 0x30) != mem_leak_period_disabled &&
                       period == mem_leak_period_enabled);
      }
      lVar4 = lVar4 + uVar5;
    }
    sVar1 = sVar1 + lVar4;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x49);
  return sVar1;
}

Assistant:

size_t MemoryLeakDetectorTable::getTotalLeaks(MemLeakPeriod period)
{
    size_t total_leaks = 0;
    for (int i = 0; i < hash_prime; i++)
        total_leaks += table_[i].getTotalLeaks(period);
    return total_leaks;
}